

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O3

bool __thiscall glu::VarType::operator==(VarType *this,VarType *other)

{
  Type TVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  
  TVar1 = this->m_type;
  if (TVar1 == other->m_type) {
    if (TVar1 == TYPE_STRUCT) {
      bVar2 = (this->m_data).array.elementType == (other->m_data).array.elementType;
    }
    else if (TVar1 == TYPE_ARRAY) {
      bVar2 = operator==((this->m_data).array.elementType,(other->m_data).array.elementType);
      bVar2 = (this->m_data).array.size == (other->m_data).array.size && bVar2;
    }
    else if (TVar1 == TYPE_BASIC) {
      iVar4 = -(uint)((other->m_data).basic.type == (this->m_data).basic.type);
      iVar5 = -(uint)((other->m_data).basic.precision == (this->m_data).basic.precision);
      auVar3._4_4_ = iVar4;
      auVar3._0_4_ = iVar4;
      auVar3._8_4_ = iVar5;
      auVar3._12_4_ = iVar5;
      iVar4 = movmskpd(0,auVar3);
      bVar2 = iVar4 == 3;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool VarType::operator== (const VarType& other) const
{
	if (m_type != other.m_type)
		return false;

	switch (m_type)
	{
		case TYPE_BASIC:
			return	m_data.basic.type == other.m_data.basic.type &&
					m_data.basic.precision == other.m_data.basic.precision;

		case TYPE_ARRAY:
			return	*m_data.array.elementType == *other.m_data.array.elementType &&
					m_data.array.size == other.m_data.array.size;

		case TYPE_STRUCT:
			return m_data.structPtr == other.m_data.structPtr;

		default:
			DE_ASSERT(false);
			return 0;
	}
}